

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O3

void __thiscall
kratos::SystemVerilogCodeGen::output_yosys_src(SystemVerilogCodeGen *this,IRNode *node)

{
  undefined1 *puVar1;
  pointer ppVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  type *fn;
  string_view sVar4;
  undefined8 uStack_28;
  
  ppVar2 = (node->fn_name_ln).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar2 != (node->fn_name_ln).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uStack_28 = in_RAX;
    sVar4 = indent(this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&(this->stream_).super_stringstream.field_0x10,sVar4._M_str,
                        sVar4._M_len);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"(* src = \"",10);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(ppVar2->first)._M_dataplus._M_p,(ppVar2->first)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" *)",4);
    puVar1 = &(this->stream_).super_stringstream.field_0x90;
    *(long *)puVar1 = *(long *)puVar1 + 1;
    uStack_28 = CONCAT17(10,(undefined7)uStack_28);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_28 + 7),1);
  }
  return;
}

Assistant:

void SystemVerilogCodeGen::output_yosys_src(IRNode* node) {
    if (!node->fn_name_ln.empty()) {
        auto const& [fn, ln] = node->fn_name_ln[0];
        stream_ << indent() << "(* src = \"" << fn << ":" << ln << "\" *)" << stream_.endl();
    }
}